

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::ArgumentsValue::expectArgs
          (ArgumentsValue *this,string *method_name,pair<unsigned_long,_unsigned_long> *pos_count,
          pair<unsigned_long,_unsigned_long> *kw_count)

{
  ulong uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1c0 [32];
  ostringstream out;
  
  uVar1 = ((long)(this->args).super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->args).super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl
                .super__Vector_impl_data._M_start) / 0x50;
  if ((pos_count->first <= uVar1) && (uVar1 <= pos_count->second)) {
    uVar1 = ((long)(this->kwargs).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->kwargs).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    if ((kw_count->first <= uVar1) && (uVar1 <= kw_count->second)) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar2 = std::operator<<((ostream *)&out,(string *)method_name);
  poVar2 = std::operator<<(poVar2," must have between ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," positional arguments and between ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," keyword arguments");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void expectArgs(const std::string & method_name, const std::pair<size_t, size_t> & pos_count, const std::pair<size_t, size_t> & kw_count) {
    if (args.size() < pos_count.first || args.size() > pos_count.second || kwargs.size() < kw_count.first || kwargs.size() > kw_count.second) {
      std::ostringstream out;
      out << method_name << " must have between " << pos_count.first << " and " << pos_count.second << " positional arguments and between " << kw_count.first << " and " << kw_count.second << " keyword arguments";
      throw std::runtime_error(out.str());
    }
  }